

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManPrintStats(Of_Man_t *p,char *pTitle)

{
  long lVar1;
  int iVar2;
  int level;
  long lVar3;
  timespec ts;
  timespec local_20;
  
  if (p->pPars->fVerbose != 0) {
    printf("%s :  ");
    printf("Delay =%8.2f ",(double)((float)(int)p->pPars->Delay * 0.1));
    printf("Area =%8d  ",(ulong)(uint)p->pPars->Area);
    printf("Edge =%9d  ",(ulong)(uint)p->pPars->Edge);
    level = 3;
    iVar2 = clock_gettime(3,&local_20);
    if (iVar2 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
    }
    lVar1 = p->clkStart;
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar3 - lVar1) / 1000000.0);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Of_ManPrintStats( Of_Man_t * p, char * pTitle )
{
    if ( !p->pPars->fVerbose )
        return;
    printf( "%s :  ", pTitle );
    printf( "Delay =%8.2f ", Of_Int2Flt((int)p->pPars->Delay) );
    printf( "Area =%8d  ",   (int)p->pPars->Area );
    printf( "Edge =%9d  ",   (int)p->pPars->Edge );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}